

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O0

void __thiscall AsyncRgbLedAnalyzer::~AsyncRgbLedAnalyzer(AsyncRgbLedAnalyzer *this)

{
  AsyncRgbLedAnalyzer *this_local;
  
  *(undefined ***)this = &PTR__AsyncRgbLedAnalyzer_0011ac90;
  Analyzer::KillThread();
  AsyncRgbLedSimulationDataGenerator::~AsyncRgbLedSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  std::unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>::
  ~unique_ptr(&this->mResults);
  std::unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>::
  ~unique_ptr(&this->mSettings);
  Analyzer2::~Analyzer2(&this->super_Analyzer2);
  return;
}

Assistant:

AsyncRgbLedAnalyzer::~AsyncRgbLedAnalyzer()
{
    KillThread();
}